

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int add_import(JSParseState *s,JSModuleDef *m,JSAtom param_3,JSAtom import_name)

{
  JSContext *ctx;
  JSAtomStruct *pJVar1;
  int iVar2;
  int iVar3;
  JSImportEntry *pJVar4;
  long lVar5;
  char *fmt;
  JSFunctionDef *s_00;
  
  ctx = s->ctx;
  if (param_3 == 0x16) {
    s_00 = s->cur_func;
    iVar2 = m->import_entries_count;
    param_3 = 0x16;
  }
  else {
    if ((param_3 == 0x3a) || (param_3 == 0x4d)) {
      fmt = "invalid import binding";
LAB_0015be1f:
      js_parse_error(s,fmt);
      return -1;
    }
    s_00 = s->cur_func;
    if (0 < (long)s_00->closure_var_count) {
      lVar5 = 0;
      do {
        if (s_00->closure_var[lVar5].var_name == param_3) {
          fmt = "duplicate import binding";
          goto LAB_0015be1f;
        }
        lVar5 = lVar5 + 1;
      } while (s_00->closure_var_count != lVar5);
    }
    iVar2 = m->import_entries_count;
  }
  iVar2 = add_closure_var(ctx,s_00,(uint)(import_name == 0x7d),0,iVar2,param_3,1,1,JS_VAR_NORMAL);
  iVar3 = -1;
  if (-1 < iVar2) {
    iVar3 = m->import_entries_count;
    if (m->import_entries_size <= iVar3) {
      iVar3 = js_realloc_array(ctx,&m->import_entries,0xc,&m->import_entries_size,iVar3 + 1);
      if (iVar3 != 0) {
        return -1;
      }
      iVar3 = m->import_entries_count;
    }
    pJVar4 = m->import_entries + iVar3;
    m->import_entries_count = iVar3 + 1;
    if (0xd1 < (int)import_name) {
      pJVar1 = ctx->rt->atom_array[import_name];
      (pJVar1->header).ref_count = (pJVar1->header).ref_count + 1;
    }
    pJVar4->import_name = import_name;
    pJVar4->var_idx = iVar2;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int add_import(JSParseState *s, JSModuleDef *m,
                      JSAtom local_name, JSAtom import_name)
{
    JSContext *ctx = s->ctx;
    int i, var_idx;
    JSImportEntry *mi;
    BOOL is_local;

    if (local_name == JS_ATOM_arguments || local_name == JS_ATOM_eval)
        return js_parse_error(s, "invalid import binding");

    if (local_name != JS_ATOM_default) {
        for (i = 0; i < s->cur_func->closure_var_count; i++) {
            if (s->cur_func->closure_var[i].var_name == local_name)
                return js_parse_error(s, "duplicate import binding");
        }
    }

    is_local = (import_name == JS_ATOM__star_);
    var_idx = add_closure_var(ctx, s->cur_func, is_local, FALSE,
                              m->import_entries_count,
                              local_name, TRUE, TRUE, FALSE);
    if (var_idx < 0)
        return -1;
    if (js_resize_array(ctx, (void **)&m->import_entries,
                        sizeof(JSImportEntry),
                        &m->import_entries_size,
                        m->import_entries_count + 1))
        return -1;
    mi = &m->import_entries[m->import_entries_count++];
    mi->import_name = JS_DupAtom(ctx, import_name);
    mi->var_idx = var_idx;
    return 0;
}